

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astnode.cpp
# Opt level: O2

void __thiscall ASTNode::execute(ASTNode *this)

{
  ASTException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (ASTException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,"No execute method",&local_39);
  ASTException::ASTException(this_00,&local_38);
  __cxa_throw(this_00,&ASTException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ASTNode::execute() {
    throw ASTException("No execute method");
}